

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.h
# Opt level: O0

int fio_str_free(fio_str_s_conflict *s)

{
  fio_str_s_conflict *__dest;
  undefined1 local_40 [48];
  fio_str_s_conflict *local_10;
  fio_str_s_conflict *s_local;
  
  local_10 = s;
  if ((s->small == '\0') && (s->dealloc != (_func_void_void_ptr *)0x0)) {
    (*s->dealloc)(s->data);
  }
  __dest = local_10;
  memset(local_40,0,0x30);
  local_40[0] = 1;
  memcpy(__dest,local_40,0x30);
  return 0;
}

Assistant:

inline FIO_FUNC int fio_str_free(fio_str_s *s) {
#ifndef FIO_STR_NO_REF
  if (!s || fio_atomic_sub(&s->ref, 1) != (uint32_t)-1)
    return -1;
#endif
  if (!s->small && s->dealloc)
    s->dealloc(s->data);
  *s = FIO_STR_INIT;
  return 0;
}